

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

Ptr<Catch::CumulativeReporterBase::SectionNode> * __thiscall
Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>::operator=
          (Ptr<Catch::CumulativeReporterBase::SectionNode> *this,SectionNode *p)

{
  Ptr<Catch::CumulativeReporterBase::SectionNode> local_20;
  Ptr<Catch::CumulativeReporterBase::SectionNode> temp;
  SectionNode *p_local;
  Ptr<Catch::CumulativeReporterBase::SectionNode> *this_local;
  
  temp.m_p = p;
  Ptr(&local_20,p);
  swap(this,&local_20);
  ~Ptr(&local_20);
  return this;
}

Assistant:

Ptr& operator = ( T* p ){
            Ptr temp( p );
            swap( temp );
            return *this;
        }